

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

void udp_pipe_close(void *arg)

{
  nni_mtx *mtx;
  udp_ep *ep;
  nni_aio *aio;
  
  ep = *arg;
  mtx = &ep->mtx;
  nni_mtx_lock(mtx);
  udp_send_disc(ep,(udp_pipe *)arg,DISC_CLOSED);
  aio = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x128));
  while (aio != (nni_aio *)0x0) {
    nni_aio_list_remove(aio);
    nni_aio_finish_error(aio,NNG_ECLOSED);
    aio = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x128));
  }
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
udp_pipe_close(void *arg)
{
	udp_pipe *p  = arg;
	udp_ep   *ep = p->ep;
	nni_aio  *aio;

	nni_mtx_lock(&ep->mtx);
	udp_send_disc(ep, p, DISC_CLOSED);
	while ((aio = nni_list_first(&p->rx_aios)) != NULL) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}
	nni_mtx_unlock(&ep->mtx);
}